

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_parser_hlsl.h
# Opt level: O2

void yy_destructor(yyParser *yypParser,uchar yymajor,YYMINORTYPE *yypminor)

{
  Context_conflict *ctx;
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,yymajor);
  if (iVar1 - 0x7dU < 0x48) {
    ctx = yypParser->ctx;
    switch(iVar1) {
    case 0x7d:
    case 0x7e:
      delete_compilation_unit(ctx,yypminor->yy139);
      return;
    case 0x7f:
    case 0x90:
    case 0x92:
      delete_variable_declaration(ctx,yypminor->yy24);
      return;
    case 0x80:
    case 0x87:
      delete_function_signature(ctx,yypminor->yy364);
      return;
    case 0x81:
    case 0xa7:
    case 0xa8:
    case 0xaf:
    case 0xb1:
      delete_statement(ctx,yypminor->yy233);
      return;
    case 0x82:
      delete_typedef(ctx,yypminor->yy71);
      return;
    case 0x83:
      delete_struct_declaration(ctx,yypminor->yy249);
      return;
    case 0x85:
      delete_scalar_or_array(ctx,yypminor->yy380);
      return;
    case 0x89:
    case 0x8a:
    case 0x8b:
      delete_function_params(ctx,yypminor->yy307);
      return;
    case 0x8e:
    case 0x9c:
    case 0xa0:
    case 0xa1:
    case 0xb3:
    case 0xb4:
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
    case 0xc0:
    case 0xc1:
    case 0xc2:
    case 0xc3:
    case 0xc4:
      delete_expr(ctx,yypminor->yy322);
      return;
    case 0x93:
    case 0x9d:
    case 0x9e:
      delete_annotation(ctx,yypminor->yy268);
      return;
    case 0x94:
      delete_variable_lowlevel(ctx,yypminor->yy82);
      return;
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
      delete_struct_member(ctx,yypminor->yy346);
      return;
    case 0x9a:
      if (yypminor->yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        (*ctx->free)(yypminor->yy8,ctx->malloc_data);
        return;
      }
      break;
    case 0xae:
    case 0xb2:
      delete_switch_case(ctx,yypminor->yy165);
      return;
    case 0xb5:
    case 0xb6:
      delete_arguments(ctx,yypminor->yy26);
      return;
    }
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  ParseHLSLARG_FETCH;
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is 
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are not used
    ** inside the C code.
    */
    case 125: /* compilation_units */
    case 126: /* compilation_unit */
{
#line 81 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_compilation_unit(ctx, (yypminor->yy139)); 
#line 2033 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 127: /* variable_declaration */
    case 144: /* variable_declaration_details_list */
    case 146: /* variable_declaration_details */
{
#line 175 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_variable_declaration(ctx, (yypminor->yy24)); 
#line 2042 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 128: /* function_signature */
    case 135: /* function_details */
{
#line 102 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_function_signature(ctx, (yypminor->yy364)); 
#line 2050 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 129: /* statement_block */
    case 167: /* statement_list */
    case 168: /* statement */
    case 175: /* for_statement */
    case 177: /* for_details */
{
#line 354 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_statement(ctx, (yypminor->yy233)); 
#line 2061 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 130: /* typedef */
{
#line 96 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_typedef(ctx, (yypminor->yy71)); 
#line 2068 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 131: /* struct_declaration */
{
#line 224 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_struct_declaration(ctx, (yypminor->yy249)); 
#line 2075 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 133: /* scalar_or_array */
{
#line 260 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_scalar_or_array(ctx, (yypminor->yy380)); 
#line 2082 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 137: /* function_parameters */
    case 138: /* function_parameter_list */
    case 139: /* function_parameter */
{
#line 124 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_function_params(ctx, (yypminor->yy307)); 
#line 2091 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 142: /* initializer */
    case 156: /* expression */
    case 160: /* initializer_block_list */
    case 161: /* initializer_block */
    case 179: /* primary_expr */
    case 180: /* postfix_expr */
    case 183: /* assignment_expr */
    case 184: /* unary_expr */
    case 185: /* cast_expr */
    case 186: /* multiplicative_expr */
    case 187: /* additive_expr */
    case 188: /* shift_expr */
    case 189: /* relational_expr */
    case 190: /* equality_expr */
    case 191: /* and_expr */
    case 192: /* exclusive_or_expr */
    case 193: /* inclusive_or_expr */
    case 194: /* logical_and_expr */
    case 195: /* logical_or_expr */
    case 196: /* conditional_expr */
{
#line 301 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_expr(ctx, (yypminor->yy322)); 
#line 2117 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 147: /* annotations */
    case 157: /* annotation_list */
    case 158: /* annotation */
{
#line 277 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_annotation(ctx, (yypminor->yy268)); 
#line 2126 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 148: /* variable_lowlevel */
{
#line 252 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_variable_lowlevel(ctx, (yypminor->yy82)); 
#line 2133 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 150: /* struct_member_list */
    case 151: /* struct_member */
    case 152: /* struct_member_details */
    case 153: /* struct_member_item_list */
{
#line 232 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_struct_member(ctx, (yypminor->yy346)); 
#line 2143 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 154: /* packoffset */
{
#line 266 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_pack_offset(ctx, (yypminor->yy8)); 
#line 2150 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 174: /* switch_case_list */
    case 178: /* switch_case */
{
#line 450 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_switch_case(ctx, (yypminor->yy165)); 
#line 2158 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    case 181: /* arguments */
    case 182: /* argument_list */
{
#line 485 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
 delete_arguments(ctx, (yypminor->yy26)); 
#line 2166 "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
}
      break;
    default:  break;   /* If no destructor action specified: do nothing */
  }
}